

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_lookup.cpp
# Opt level: O0

void __thiscall ON_SerialNumberMap::GarbageCollectHelper(ON_SerialNumberMap *this)

{
  uint uVar1;
  void *__src;
  size_t sz;
  ON_SN_BLOCK *pOVar2;
  ON__UINT64 OVar3;
  bool bVar4;
  ON_SN_BLOCK **local_78;
  uint local_68;
  ulong local_60;
  ON__UINT64 sn1;
  ON_SN_BLOCK *blk;
  SN_ELEMENT *snarray;
  ON__UINT32 snarray_count;
  ON__UINT32 n;
  ON__UINT32 k;
  ON__UINT32 j;
  ON__UINT64 m;
  ON__UINT64 i;
  ON_SerialNumberMap *this_local;
  
  Internal_HashTableInvalidate(this);
  if (this->m_sn_block0->m_purged == 0) {
    if ((this->m_sn_block0->m_sorted == 0) &&
       (ON_SN_BLOCK::SortBlockHelper(this->m_sn_block0), this->m_snblk_list_count == 0)) {
      ON_SerialNumberMapPrivate::SetMaxSn(this->m_private,this->m_sn_block0->m_sn1);
    }
  }
  else {
    this->m_sn_count = this->m_sn_count - (ulong)this->m_sn_block0->m_purged;
    this->m_sn_purged = this->m_sn_purged - (ulong)this->m_sn_block0->m_purged;
    ON_SN_BLOCK::CullBlockHelper(this->m_sn_block0);
    if (this->m_sn_block0->m_sorted == 0) {
      ON_SN_BLOCK::SortBlockHelper(this->m_sn_block0);
    }
    if (this->m_snblk_list_count == 0) {
      ON_SerialNumberMapPrivate::SetMaxSn(this->m_private,this->m_sn_block0->m_sn1);
    }
    if (this->m_sn_block0->m_count < 0x1c00) {
      return;
    }
  }
  this->m_sn_purged = 0;
  this->m_sn_count = (ulong)this->m_sn_block0->m_count;
  m = this->m_snblk_list_count;
  while (OVar3 = m - 1, m != 0) {
    if (this->m_snblk_list[OVar3]->m_purged != 0) {
      ON_SN_BLOCK::CullBlockHelper(this->m_snblk_list[OVar3]);
    }
    this->m_sn_count = (ulong)this->m_snblk_list[OVar3]->m_count + this->m_sn_count;
    m = OVar3;
  }
  for (m = 0; m < this->m_snblk_list_count; m = m + 1) {
    _k = m;
    if (this->m_snblk_list[m]->m_count == 0) goto LAB_006b871b;
  }
  goto LAB_006b87dc;
LAB_006b89fa:
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_lookup.cpp"
             ,0x61b,"","Bogus information - should never get here");
LAB_006b8a24:
  uVar1 = pOVar2->m_count - n;
  if (uVar1 == 0) {
    while( true ) {
      bVar4 = false;
      if (snarray_count < this->m_sn_block0->m_count) {
        bVar4 = this->m_sn_block0->m_sn[snarray_count].m_sn < local_60;
      }
      if (!bVar4) break;
      memcpy((void *)((long)__src + (ulong)(uint)snarray * 0x38),
             this->m_sn_block0->m_sn + snarray_count,0x38);
      snarray._0_4_ = (uint)snarray + 1;
      snarray_count = snarray_count + 1;
    }
  }
  else {
    memcpy((void *)((long)__src + (ulong)(uint)snarray * 0x38),pOVar2->m_sn + n,(ulong)uVar1 * 0x38)
    ;
    snarray._0_4_ = uVar1 + (uint)snarray;
  }
  if ((uint)snarray < 0x2001) {
    local_68 = (uint)snarray;
  }
  else {
    local_68 = 0x2000;
  }
  if (snarray_count < this->m_sn_block0->m_count) {
    memcpy((void *)((long)__src + (ulong)(uint)snarray * 0x38),
           this->m_sn_block0->m_sn + snarray_count,
           (ulong)(this->m_sn_block0->m_count - snarray_count) * 0x38);
    snarray._0_4_ = (this->m_sn_block0->m_count - snarray_count) + (uint)snarray;
  }
  pOVar2->m_count = local_68;
  memcpy(pOVar2->m_sn,__src,(ulong)pOVar2->m_count * 0x38);
  pOVar2->m_sn0 = pOVar2->m_sn[0].m_sn;
  pOVar2->m_sn1 = pOVar2->m_sn[pOVar2->m_count - 1].m_sn;
  if (local_68 < (uint)snarray) {
    this->m_sn_block0->m_count = (uint)snarray - local_68;
    memcpy(this->m_sn_block0->m_sn,(void *)((long)__src + (ulong)local_68 * 0x38),
           (ulong)this->m_sn_block0->m_count * 0x38);
    this->m_sn_block0->m_sn0 = this->m_sn_block0->m_sn[0].m_sn;
    this->m_sn_block0->m_sn1 = this->m_sn_block0->m_sn[this->m_sn_block0->m_count - 1].m_sn;
  }
  else {
    ON_SN_BLOCK::EmptyBlock(this->m_sn_block0);
  }
LAB_006b8c57:
  m = m + 1;
  goto LAB_006b882e;
  while (this->m_snblk_list[_k]->m_count == 0) {
LAB_006b871b:
    _k = _k + 1;
    if (this->m_snblk_list_count <= _k) goto LAB_006b877e;
  }
  ON_qsort(this->m_snblk_list + m,this->m_snblk_list_count - m,8,ON_SN_BLOCK::CompareMaxSN);
LAB_006b877e:
  while( true ) {
    bVar4 = false;
    if (this->m_snblk_list_count != 0) {
      bVar4 = this->m_snblk_list[this->m_snblk_list_count - 1]->m_count == 0;
    }
    if (!bVar4) break;
    this->m_snblk_list_count = this->m_snblk_list_count - 1;
  }
LAB_006b87dc:
  if ((this->m_snblk_list_count != 0) &&
     (this->m_sn_block0->m_sn0 < this->m_snblk_list[this->m_snblk_list_count - 1]->m_sn1)) {
    __src = onmalloc(0xe0000);
    m = 0;
LAB_006b882e:
    bVar4 = false;
    if (m < this->m_snblk_list_count) {
      bVar4 = this->m_sn_block0->m_count != 0;
    }
    if (bVar4) {
      if (this->m_sn_block0->m_sn0 <= this->m_snblk_list[m]->m_sn1) {
        pOVar2 = this->m_snblk_list[m];
        if (m < this->m_snblk_list_count - 1) {
          local_60 = this->m_snblk_list[m + 1]->m_sn0;
        }
        else {
          local_60 = this->m_sn_block0->m_sn1 + 1;
        }
        snarray_count = 0;
        n = 0;
        snarray._0_4_ = 0;
        do {
          bVar4 = false;
          if (n < pOVar2->m_count) {
            bVar4 = snarray_count < this->m_sn_block0->m_count;
          }
          if (!bVar4) goto LAB_006b8a24;
          if (pOVar2->m_sn[n].m_sn < this->m_sn_block0->m_sn[snarray_count].m_sn) {
            memcpy((void *)((long)__src + (ulong)(uint)snarray * 0x38),pOVar2->m_sn + n,0x38);
            n = n + 1;
          }
          else {
            if (local_60 <= this->m_sn_block0->m_sn[snarray_count].m_sn) goto LAB_006b89fa;
            memcpy((void *)((long)__src + (ulong)(uint)snarray * 0x38),
                   this->m_sn_block0->m_sn + snarray_count,0x38);
            snarray_count = snarray_count + 1;
          }
          snarray._0_4_ = (uint)snarray + 1;
        } while( true );
      }
      goto LAB_006b8c57;
    }
    onfree(__src);
  }
  for (m = 0; _k = m, m < this->m_snblk_list_count; m = m + 1) {
    while ((_k = _k + 1, _k < this->m_snblk_list_count && (this->m_snblk_list[m]->m_count < 0x2000))
          ) {
      GarbageCollectMoveHelper(this,this->m_snblk_list[m],this->m_snblk_list[_k]);
    }
  }
  while( true ) {
    bVar4 = false;
    if (this->m_snblk_list_count != 0) {
      bVar4 = this->m_snblk_list[this->m_snblk_list_count - 1]->m_count == 0;
    }
    if (!bVar4) break;
    this->m_snblk_list_count = this->m_snblk_list_count - 1;
  }
  if (0x800 < this->m_sn_block0->m_count) {
    if (this->m_snblk_list_count != 0) {
      GarbageCollectMoveHelper
                (this,this->m_snblk_list[this->m_snblk_list_count - 1],this->m_sn_block0);
    }
    if (0x1000 < this->m_sn_block0->m_count) {
      if (this->m_snblk_list_count == this->m_snblk_list_capacity) {
        m = this->m_snblk_list_capacity;
        this->m_snblk_list_capacity = this->m_snblk_list_capacity + 0x20;
        sz = this->m_snblk_list_capacity << 3;
        if (this->m_snblk_list == (ON_SN_BLOCK **)0x0) {
          local_78 = (ON_SN_BLOCK **)onmalloc(sz);
        }
        else {
          local_78 = (ON_SN_BLOCK **)onrealloc(this->m_snblk_list,sz);
        }
        this->m_snblk_list = local_78;
        while (m < this->m_snblk_list_capacity) {
          this->m_snblk_list[m] = (ON_SN_BLOCK *)0x0;
          m = m + 1;
        }
      }
      if (this->m_snblk_list[this->m_snblk_list_count] == (ON_SN_BLOCK *)0x0) {
        pOVar2 = (ON_SN_BLOCK *)onmalloc(0x70020);
        this->m_snblk_list[this->m_snblk_list_count] = pOVar2;
      }
      OVar3 = this->m_snblk_list_count;
      this->m_snblk_list_count = OVar3 + 1;
      memcpy(this->m_snblk_list[OVar3],this->m_sn_block0,0x70020);
      ON_SN_BLOCK::EmptyBlock(this->m_sn_block0);
    }
  }
  return;
}

Assistant:

void ON_SerialNumberMap::GarbageCollectHelper()
{
  ON__UINT64 i,m;
  ON__UINT32 j,k,n;

  // This is a helper function.  The caller
  // should check that ON_SN_BLOCK::SN_BLOCK_CAPACITY == m_sn_block0.m_count
  // before calling it.

  // memory location for specific elements will be changed.
  // This will make the hash table invalid.
  Internal_HashTableInvalidate();

  if ( m_sn_block0.m_purged > 0 )
  {
    m_sn_count -= m_sn_block0.m_purged;
    m_sn_purged -= m_sn_block0.m_purged;
    m_sn_block0.CullBlockHelper();
    if ( !m_sn_block0.m_sorted )
      m_sn_block0.SortBlockHelper();
    if ( 0 == m_snblk_list_count )
      m_private->SetMaxSn(m_sn_block0.m_sn1);
    if ( m_sn_block0.m_count < 7*(ON_SN_BLOCK::SN_BLOCK_CAPACITY/8) )
      return;
  }
  else if ( !m_sn_block0.m_sorted )
  {
    m_sn_block0.SortBlockHelper();
    if ( 0 == m_snblk_list_count )
      m_private->SetMaxSn(m_sn_block0.m_sn1);
  }

  // Remove all purged serial numbers from every block
  // and make sure every block is sorted.
  m_sn_purged = 0;
  m_sn_count = m_sn_block0.m_count;
  i = m_snblk_list_count;
  while (i--)
  {
    if ( m_snblk_list[i]->m_purged > 0 )
    {
      // The next call may empty m_snblk_list[i].
      m_snblk_list[i]->CullBlockHelper();
    }
    m_sn_count += m_snblk_list[i]->m_count;
  }

  // Put empty blocks at the end of the list
  for ( i = 0; i < m_snblk_list_count; i++ )
  {
    if ( 0 == m_snblk_list[i]->m_count )
    {
      // m_snblk_list[i] is empty ...
      for(m = i+1; m < m_snblk_list_count; m++ )
      {
        if ( m_snblk_list[m]->m_count > 0 )
        {
          // ... and m_snblk_list[m] is not empty
          ON_qsort(m_snblk_list+i,(size_t)(m_snblk_list_count-i),sizeof(*m_snblk_list),ON_SN_BLOCK::CompareMaxSN);
          break;
        }
      }
      while ( m_snblk_list_count > 0 && 0 == m_snblk_list[m_snblk_list_count-1]->m_count )
        m_snblk_list_count--;
      break;
    }
  }

  if (    m_snblk_list_count > 0 
       && m_snblk_list[m_snblk_list_count-1]->m_sn1 > m_sn_block0.m_sn0 
     )
  {
    // Merge the serial number lists so the blocks in m_sn_list[]
    // have the lowest serial numbers and m_sn_block0.m_sn[] contains
    // the largest.
    ON__UINT32 snarray_count = 0;
    struct SN_ELEMENT* snarray = (struct SN_ELEMENT*)onmalloc(2*ON_SN_BLOCK::SN_BLOCK_CAPACITY*sizeof(snarray[0]));
    for ( i = 0; i < m_snblk_list_count && m_sn_block0.m_count > 0; i++ )
    {
      if ( m_snblk_list[i]->m_sn1 < m_sn_block0.m_sn0 )
        continue;

      // Move some entries in m_sn_block0.m_sn[] 
      // to m_snblk_list[i]->m_sn[].
      ON_SN_BLOCK* blk = m_snblk_list[i];
      const ON__UINT64 sn1 = (i < m_snblk_list_count-1) 
                             ? m_snblk_list[i+1]->m_sn0 
                             : (m_sn_block0.m_sn1+1);
      snarray_count = j = k = 0;
      while(j < blk->m_count && k < m_sn_block0.m_count )
      {
        if ( blk->m_sn[j].m_sn < m_sn_block0.m_sn[k].m_sn )
        {
          snarray[snarray_count++] = blk->m_sn[j++];
        }
        else if ( m_sn_block0.m_sn[k].m_sn < sn1 )
        {
          snarray[snarray_count++] = m_sn_block0.m_sn[k++];
        }
        else
        {
          // If m_sn_block0.m_sn[m_sn_block0.m_count-1].m_sn is the largest
          // value, then we should get j == blk->m_count exit.
          // If blk->m_sn[blk->m_count-1].m_sn is the largest value,
          // then we should get k == m_sn_block0.m_count and exit.
          ON_ERROR("Bogus information - should never get here");
          break;
        }
      }
      n = blk->m_count-j;
      if ( n > 0 )
      {
        memcpy(&snarray[snarray_count],&blk->m_sn[j],(size_t)(n*sizeof(snarray[0])));
        snarray_count += n;
      }
      else
      {
        while ( k < m_sn_block0.m_count && m_sn_block0.m_sn[k].m_sn < sn1 )
          snarray[snarray_count++] = m_sn_block0.m_sn[k++];
      }
      n = (snarray_count > ON_SN_BLOCK::SN_BLOCK_CAPACITY) 
        ? ON_SN_BLOCK::SN_BLOCK_CAPACITY 
        : snarray_count;
      if ( k < m_sn_block0.m_count )
      {
        memcpy(&snarray[snarray_count],
               &m_sn_block0.m_sn[k],
               (size_t)((m_sn_block0.m_count-k)*sizeof(snarray[0]))
               );
        snarray_count += (m_sn_block0.m_count-k);
      }
      blk->m_count = n;
      memcpy(&blk->m_sn[0],snarray,(size_t)(blk->m_count*sizeof(blk->m_sn[0])));
      blk->m_sn0 = blk->m_sn[0].m_sn;
      blk->m_sn1 = blk->m_sn[blk->m_count-1].m_sn;
      if ( snarray_count > n )
      {
        // put the end of snarray[] (the largest serial numbers)
        // in m_sn_block0.m_sn[].
        m_sn_block0.m_count = (snarray_count-n);
        memcpy(&m_sn_block0.m_sn[0],
               &snarray[n],
               (size_t)(m_sn_block0.m_count*sizeof(m_sn_block0.m_sn[0]))
               );
        m_sn_block0.m_sn0 = m_sn_block0.m_sn[0].m_sn;
        m_sn_block0.m_sn1 = m_sn_block0.m_sn[m_sn_block0.m_count-1].m_sn;
      }
      else
      {
        m_sn_block0.EmptyBlock();
      }
    }
    onfree(snarray);
    snarray = 0;
  }

  // Compact the blocks in m_sn_list[]
  for ( i = 0; i < m_snblk_list_count; i++ )
  {
    for ( m = i+1; m < m_snblk_list_count; m++ )
    {
      if ( m_snblk_list[i]->m_count >= ON_SN_BLOCK::SN_BLOCK_CAPACITY )
        break;
      GarbageCollectMoveHelper(m_snblk_list[i],m_snblk_list[m]);
    }
  }
  while ( m_snblk_list_count > 0 && 0 == m_snblk_list[m_snblk_list_count-1]->m_count )
  {
    m_snblk_list_count--;
  }

  // Make sure m_sn_block0.m_an[] is has plenty of room
  if ( m_sn_block0.m_count > ON_SN_BLOCK::SN_BLOCK_CAPACITY/4 )
  {
    if ( m_snblk_list_count > 0 )
    {
      GarbageCollectMoveHelper(m_snblk_list[m_snblk_list_count-1],&m_sn_block0);
    }
    if ( m_sn_block0.m_count > ON_SN_BLOCK::SN_BLOCK_CAPACITY/2 )
    {
      // Need to add a new block to m_snblk_list[]
      if ( m_snblk_list_count == m_snblk_list_capacity )
      {
        // Add room to store more pointers to blocks in the m_sn_list[]
        i = m_snblk_list_capacity;
        m_snblk_list_capacity += 32;
        m = m_snblk_list_capacity*sizeof(m_snblk_list[0]);
        m_snblk_list = (ON_SN_BLOCK**)((0 == m_snblk_list)
                     ? onmalloc((size_t)m)
                     : onrealloc(m_snblk_list,(size_t)m));
        while ( i < m_snblk_list_capacity )
          m_snblk_list[i++] = 0;
      }
      if ( 0 == m_snblk_list[m_snblk_list_count] )
      {
        // add room to store at more serial numbers
        m_snblk_list[m_snblk_list_count] = (ON_SN_BLOCK*)onmalloc(sizeof(*(m_snblk_list[m_snblk_list_count])));
      }
      *m_snblk_list[m_snblk_list_count++] = m_sn_block0;
      m_sn_block0.EmptyBlock();
    }
  }
}